

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
gtl::
dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
::set_empty_key(dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
                *this,const_reference val)

{
  bool bVar1;
  bool bVar2;
  result_type a;
  value_alloc_type *this_00;
  LabelledCell *pLVar3;
  key_type *key;
  const_reference val_local;
  dense_hashtable<S2CellIndex::LabelledCell,_S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::Identity,_gtl::dense_hash_set<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>::SetKey,_std::equal_to<S2CellIndex::LabelledCell>,_std::allocator<S2CellIndex::LabelledCell>_>
  *this_local;
  
  bVar1 = sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
          ::use_empty((sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
                       *)this);
  if (bVar1) {
    __assert_fail("!settings.use_empty() && \"Calling set_empty_key multiple times\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x228,
                  "void gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::set_empty_key(const_reference) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  a = get_key(this,val);
  bVar1 = sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
          ::use_deleted((sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
                         *)this);
  if (bVar1) {
    bVar2 = equals(this,a,&(this->key_info).delkey);
    bVar1 = false;
    if (bVar2) goto LAB_0045e081;
  }
  bVar1 = true;
LAB_0045e081:
  if (!bVar1) {
    __assert_fail("(!settings.use_deleted() || !equals(key, key_info.delkey)) && \"Setting the empty key the same as the deleted key\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x22d,
                  "void gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::set_empty_key(const_reference) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
  ::set_use_empty((sh_hashtable_settings<S2CellIndex::LabelledCell,_S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash,_unsigned_long,_4>
                   *)this,true);
  (this->key_info).empty.cell_id.id_ = (a->cell_id).id_;
  (this->key_info).empty.label = a->label;
  if (this->table != (pointer)0x0) {
    __assert_fail("!table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                  ,0x232,
                  "void gtl::dense_hashtable<S2CellIndex::LabelledCell, S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, std::equal_to<S2CellIndex::LabelledCell>, std::allocator<S2CellIndex::LabelledCell>>::set_empty_key(const_reference) [Value = S2CellIndex::LabelledCell, Key = S2CellIndex::LabelledCell, HashFcn = S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash, ExtractKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::Identity, SetKey = gtl::dense_hash_set<S2CellIndex::LabelledCell, S2ClosestCellQueryBase<S2MinDistance>::LabelledCellHash>::SetKey, EqualKey = std::equal_to<S2CellIndex::LabelledCell>, Alloc = std::allocator<S2CellIndex::LabelledCell>]"
                 );
  }
  this_00 = get_internal_allocator(this);
  pLVar3 = __gnu_cxx::new_allocator<S2CellIndex::LabelledCell>::allocate
                     ((new_allocator<S2CellIndex::LabelledCell> *)this_00,this->num_buckets,
                      (void *)0x0);
  this->table = pLVar3;
  fill_range_with_empty(this,this->table,this->table + this->num_buckets);
  return;
}

Assistant:

void set_empty_key(const_reference val) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    const key_type& key = get_key(val);
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty.~key_type();
    new (&key_info.empty) key_type(key);

    assert(!table);                  // must set before first use
    // num_buckets was set in constructor even though table was nullptr
    table = get_internal_allocator().allocate(num_buckets);
    fill_range_with_empty(table, table + num_buckets);
  }